

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_astTupleSlotNamedReferenceAtNode_primitiveAnalyzeAndEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong immediateTypeTag;
  sysbvm_tuple_t sVar1;
  anon_struct_40_5_e253c8e7 gcFrame;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_tuple_t *local_88;
  sysbvm_tuple_t sStack_80;
  sysbvm_tuple_t local_78;
  sysbvm_tuple_t sStack_70;
  sysbvm_tuple_t local_68;
  sysbvm_stackFrameRecord_t local_60;
  undefined8 local_50;
  sysbvm_stackFrameRecord_t local_48;
  undefined8 local_38;
  undefined1 *puStack_30;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  local_78 = 0;
  sStack_70 = 0;
  local_88 = (sysbvm_tuple_t *)0x0;
  sStack_80 = 0;
  local_68 = 0;
  local_48.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_48.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_48._12_4_ = 0;
  local_38 = 5;
  puStack_30 = (undefined1 *)&local_88;
  sysbvm_stackFrame_pushRecord(&local_48);
  local_60.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_60.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  local_50 = *(undefined8 *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord(&local_60);
  local_88 = (sysbvm_tuple_t *)
             sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment
                       (context,*(sysbvm_tuple_t *)(*arguments + 0x28),arguments[1]);
  sVar1 = *(sysbvm_tuple_t *)(*arguments + 0x38);
  if (sVar1 == 0) {
    sStack_80 = sysbvm_interpreter_evaluateASTWithEnvironment
                          (context,*(sysbvm_tuple_t *)(*arguments + 0x30),arguments[1]);
    immediateTypeTag = (ulong)local_88 & 0xf;
    if (immediateTypeTag == 0 && local_88 != (sysbvm_tuple_t *)0x0) {
      sVar1 = *local_88;
    }
    else if ((int)immediateTypeTag == 0xf) {
      sVar1 = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,(ulong)local_88 >> 4);
    }
    else {
      sVar1 = sysbvm_tuple_getImmediateTypeWithTag(context,immediateTypeTag);
    }
    local_78 = sysbvm_type_lookupSlot(context,sVar1,sStack_80);
    sVar1 = local_78;
    if (local_78 == 0) {
      sysbvm_error("Failed to find the slot with the specified name.");
      sVar1 = local_78;
    }
  }
  local_78 = sVar1;
  local_68 = sysbvm_typeSlot_getValidReferenceType(context,local_78);
  sStack_70 = sysbvm_referenceType_withTupleAndTypeSlot
                        (context,local_68,(sysbvm_tuple_t)local_88,local_78);
  sysbvm_stackFrame_popRecord(&local_60);
  sysbvm_stackFrame_popRecord(&local_48);
  return sStack_70;
}

Assistant:

static sysbvm_tuple_t sysbvm_astTupleSlotNamedReferenceAtNode_primitiveAnalyzeAndEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_astTupleSlotNamedAtNode_t **node = (sysbvm_astTupleSlotNamedAtNode_t**)&arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    struct {
        sysbvm_tuple_t tuple;
        sysbvm_tuple_t name;
        sysbvm_tuple_t slot;
        sysbvm_tuple_t result;
        sysbvm_tuple_t resultType;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*node)->super.sourcePosition);

    gcFrame.tuple = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, (*node)->tupleExpression, *environment);
    if((*node)->boundSlot)
    {
        gcFrame.slot = (*node)->boundSlot;
    }
    else
    {
        gcFrame.name = sysbvm_interpreter_evaluateASTWithEnvironment(context, (*node)->nameExpression, *environment);
        gcFrame.slot = sysbvm_type_lookupSlot(context, sysbvm_tuple_getType(context, gcFrame.tuple), gcFrame.name);
        if(!gcFrame.slot)
            sysbvm_error("Failed to find the slot with the specified name.");
    }

    gcFrame.resultType = sysbvm_typeSlot_getValidReferenceType(context, gcFrame.slot);
    gcFrame.result = sysbvm_referenceType_withTupleAndTypeSlot(context, gcFrame.resultType, gcFrame.tuple, gcFrame.slot);

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}